

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void I422AlphaToARGBRow_C
               (uint8_t *src_y,uint8_t *src_u,uint8_t *src_v,uint8_t *src_a,uint8_t *rgb_buf,
               YuvConstants *yuvconstants,int width)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  short sVar6;
  short sVar7;
  int iVar8;
  uint8_t uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  byte *local_48;
  uint8_t *local_40;
  
  local_48 = src_y;
  local_40 = src_a;
  if (1 < width) {
    lVar12 = 0;
    do {
      bVar1 = *src_u;
      uVar10 = (int)yuvconstants->kYToRgb[0] * (uint)src_y[lVar12] * 0x101 >> 0x10;
      iVar13 = ((int)yuvconstants->kUVBiasB[0] - (int)yuvconstants->kUVToB[0] * (uint)bVar1) +
               uVar10;
      if (iVar13 >> 6 < 1) {
        iVar13 = 0;
      }
      iVar13 = iVar13 >> 6;
      if (0xfe < iVar13) {
        iVar13 = 0xff;
      }
      bVar2 = *src_v;
      cVar3 = yuvconstants->kUVToG[0];
      cVar4 = yuvconstants->kUVToG[1];
      cVar5 = yuvconstants->kUVToR[1];
      sVar6 = yuvconstants->kUVBiasG[0];
      sVar7 = yuvconstants->kUVBiasR[0];
      *rgb_buf = (uint8_t)iVar13;
      iVar13 = ((int)sVar6 - ((int)cVar4 * (uint)bVar2 + (int)cVar3 * (uint)bVar1)) + uVar10;
      if (iVar13 >> 6 < 1) {
        iVar13 = 0;
      }
      iVar13 = iVar13 >> 6;
      if (0xfe < iVar13) {
        iVar13 = 0xff;
      }
      rgb_buf[1] = (uint8_t)iVar13;
      iVar13 = ((int)sVar7 - (int)cVar5 * (uint)bVar2) + uVar10;
      if (iVar13 >> 6 < 1) {
        iVar13 = 0;
      }
      iVar13 = iVar13 >> 6;
      if (0xfe < iVar13) {
        iVar13 = 0xff;
      }
      rgb_buf[2] = (uint8_t)iVar13;
      rgb_buf[3] = src_a[lVar12];
      bVar1 = *src_u;
      bVar2 = *src_v;
      cVar3 = yuvconstants->kUVToG[0];
      cVar4 = yuvconstants->kUVToG[1];
      cVar5 = yuvconstants->kUVToR[1];
      sVar6 = yuvconstants->kUVBiasG[0];
      sVar7 = yuvconstants->kUVBiasR[0];
      uVar10 = (int)yuvconstants->kYToRgb[0] * (uint)src_y[lVar12 + 1] * 0x101 >> 0x10;
      iVar13 = ((int)yuvconstants->kUVBiasB[0] - (int)yuvconstants->kUVToB[0] * (uint)bVar1) +
               uVar10;
      if (iVar13 >> 6 < 1) {
        iVar13 = 0;
      }
      iVar13 = iVar13 >> 6;
      if (0xfe < iVar13) {
        iVar13 = 0xff;
      }
      rgb_buf[4] = (uint8_t)iVar13;
      iVar13 = ((int)sVar6 - ((int)cVar4 * (uint)bVar2 + (int)cVar3 * (uint)bVar1)) + uVar10;
      if (iVar13 >> 6 < 1) {
        iVar13 = 0;
      }
      iVar13 = iVar13 >> 6;
      if (0xfe < iVar13) {
        iVar13 = 0xff;
      }
      rgb_buf[5] = (uint8_t)iVar13;
      iVar13 = ((int)sVar7 - (int)cVar5 * (uint)bVar2) + uVar10;
      if (iVar13 >> 6 < 1) {
        iVar13 = 0;
      }
      iVar13 = iVar13 >> 6;
      if (0xfe < iVar13) {
        iVar13 = 0xff;
      }
      rgb_buf[6] = (uint8_t)iVar13;
      rgb_buf[7] = src_a[lVar12 + 1];
      src_u = src_u + 1;
      src_v = src_v + 1;
      rgb_buf = rgb_buf + 8;
      lVar12 = lVar12 + 2;
    } while ((int)lVar12 < width + -1);
    local_48 = src_y + lVar12;
    local_40 = src_a + lVar12;
  }
  if ((width & 1U) != 0) {
    uVar10 = (int)yuvconstants->kYToRgb[0] * (uint)*local_48 * 0x101 >> 0x10;
    iVar13 = (int)(((int)yuvconstants->kUVBiasB[0] - (int)yuvconstants->kUVToB[0] * (uint)*src_u) +
                  uVar10) >> 6;
    iVar8 = 0;
    if (iVar13 < 1) {
      iVar13 = iVar8;
    }
    uVar9 = (uint8_t)iVar13;
    if (0xfe < iVar13) {
      uVar9 = 0xff;
    }
    iVar13 = (int)(((int)yuvconstants->kUVBiasG[0] -
                   ((int)yuvconstants->kUVToG[1] * (uint)*src_v +
                   (int)yuvconstants->kUVToG[0] * (uint)*src_u)) + uVar10) >> 6;
    if (iVar13 < 1) {
      iVar13 = iVar8;
    }
    if (0xfe < iVar13) {
      iVar13 = 0xff;
    }
    iVar11 = (int)(((int)yuvconstants->kUVBiasR[0] - (int)yuvconstants->kUVToR[1] * (uint)*src_v) +
                  uVar10) >> 6;
    if (iVar11 < 1) {
      iVar11 = iVar8;
    }
    *rgb_buf = uVar9;
    if (0xfe < iVar11) {
      iVar11 = 0xff;
    }
    rgb_buf[1] = (uint8_t)iVar13;
    rgb_buf[2] = (uint8_t)iVar11;
    rgb_buf[3] = *local_40;
  }
  return;
}

Assistant:

void I422AlphaToARGBRow_C(const uint8_t* src_y,
                          const uint8_t* src_u,
                          const uint8_t* src_v,
                          const uint8_t* src_a,
                          uint8_t* rgb_buf,
                          const struct YuvConstants* yuvconstants,
                          int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel(src_y[0], src_u[0], src_v[0], rgb_buf + 0, rgb_buf + 1,
             rgb_buf + 2, yuvconstants);
    rgb_buf[3] = src_a[0];
    YuvPixel(src_y[1], src_u[0], src_v[0], rgb_buf + 4, rgb_buf + 5,
             rgb_buf + 6, yuvconstants);
    rgb_buf[7] = src_a[1];
    src_y += 2;
    src_u += 1;
    src_v += 1;
    src_a += 2;
    rgb_buf += 8;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel(src_y[0], src_u[0], src_v[0], rgb_buf + 0, rgb_buf + 1,
             rgb_buf + 2, yuvconstants);
    rgb_buf[3] = src_a[0];
  }
}